

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res,
          ContentReceiver *receiver,MultipartContentHeader *mulitpart_header,
          MultipartContentReceiver *multipart_receiver)

{
  size_t payload_max_length;
  bool bVar1;
  function<bool_(const_char_*,_unsigned_long)> local_238;
  function<bool_(unsigned_long,_unsigned_long)> local_218;
  anon_class_24_3_23d8765b local_1f8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  string boundary;
  string *content_type;
  undefined1 local_180 [8];
  ContentReceiver out;
  MultipartFormDataParser multipart_form_data_parser;
  ContentReceiver *receiver_local;
  Response *res_local;
  Request *req_local;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  detail::MultipartFormDataParser::MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  std::function<bool_(const_char_*,_unsigned_long)>::function
            ((function<bool_(const_char_*,_unsigned_long)> *)local_180);
  bVar1 = Request::is_multipart_form_data(req);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_
              ((string *)((long)&boundary.field_2 + 8),req,"Content-Type",0);
    std::__cxx11::string::string((string *)local_1d8);
    bVar1 = detail::parse_multipart_boundary
                      ((string *)((long)&boundary.field_2 + 8),(string *)local_1d8);
    if (bVar1) {
      detail::MultipartFormDataParser::set_boundary
                ((MultipartFormDataParser *)&out._M_invoker,(string *)local_1d8);
      local_1f8.multipart_form_data_parser = (MultipartFormDataParser *)&out._M_invoker;
      local_1f8.multipart_receiver = multipart_receiver;
      local_1f8.mulitpart_header = mulitpart_header;
      std::function<bool(char_const*,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long)> *)local_180,&local_1f8);
    }
    else {
      res->status = 400;
      this_local._7_1_ = write_response(this,strm,last_connection,req,res);
    }
    local_1dc = (uint)!bVar1;
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
    if (local_1dc != 0) goto LAB_0023cb8e;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::operator=
              ((function<bool_(const_char_*,_unsigned_long)> *)local_180,receiver);
  }
  payload_max_length = this->payload_max_length_;
  std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_218);
  std::function<bool_(const_char_*,_unsigned_long)>::function
            (&local_238,(function<bool_(const_char_*,_unsigned_long)> *)local_180);
  bVar1 = detail::read_content<httplib::Request>
                    (strm,req,payload_max_length,&res->status,&local_218,&local_238);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_238);
  std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_218);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = Request::is_multipart_form_data(req);
    if ((!bVar1) ||
       (bVar1 = detail::MultipartFormDataParser::is_valid
                          ((MultipartFormDataParser *)&out._M_invoker), bVar1)) {
      this_local._7_1_ = 1;
      local_1dc = 1;
    }
    else {
      res->status = 400;
      this_local._7_1_ = write_response(this,strm,last_connection,req,res);
      local_1dc = 1;
    }
  }
  else {
    this_local._7_1_ = write_response(this,strm,last_connection,req,res);
    local_1dc = 1;
  }
LAB_0023cb8e:
  std::function<bool_(const_char_*,_unsigned_long)>::~function
            ((function<bool_(const_char_*,_unsigned_long)> *)local_180);
  detail::MultipartFormDataParser::~MultipartFormDataParser
            ((MultipartFormDataParser *)&out._M_invoker);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool
Server::read_content_core(Stream &strm, bool last_connection,
                          Request &req, Response &res,
                          ContentReceiver receiver,
                          MultipartContentHeader mulitpart_header,
                          MultipartContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiver out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }

    multipart_form_data_parser.set_boundary(boundary);
    out = [&](const char *buf, size_t n) {
      return multipart_form_data_parser.parse(buf, n, multipart_receiver, mulitpart_header);
    };
  } else {
    out = receiver;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status,
                            Progress(), out)) {
    return write_response(strm, last_connection, req, res);
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return write_response(strm, last_connection, req, res);
    }
  }

  return true;
}